

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void cmExtraEclipseCDT4Generator::AppendStorageScanners
               (cmGeneratedFileStream *fout,cmMakefile *makefile)

{
  undefined8 uVar1;
  char *pcVar2;
  ulong uVar3;
  allocator local_2a9;
  string local_2a8;
  allocator local_281;
  string local_280;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  allocator local_171;
  undefined1 local_170 [8];
  string compilerArgs;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string arg1;
  string local_b0;
  undefined1 local_90 [8];
  string compiler;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  string make;
  cmMakefile *makefile_local;
  cmGeneratedFileStream *fout_local;
  
  make.field_2._8_8_ = makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"CMAKE_MAKE_PROGRAM",&local_59);
  pcVar2 = cmMakefile::GetRequiredDefinition(makefile,&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_38,pcVar2,(allocator *)(compiler.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(compiler.field_2._M_local_buf + 0xb));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  uVar1 = make.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,"CMAKE_C_COMPILER",(allocator *)(arg1.field_2._M_local_buf + 0xf));
  pcVar2 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_90,pcVar2,(allocator *)(arg1.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(arg1.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)(arg1.field_2._M_local_buf + 0xf));
  uVar1 = make.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"CMAKE_C_COMPILER_ARG1",&local_f9);
  pcVar2 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_d8,pcVar2,&local_fa);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  uVar3 = std::__cxx11::string::empty();
  uVar1 = make.field_2._8_8_;
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"CMAKE_CXX_COMPILER",&local_121);
    pcVar2 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_120);
    std::__cxx11::string::operator=((string *)local_90,pcVar2);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    uVar1 = make.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_148,"CMAKE_CXX_COMPILER_ARG1",
               (allocator *)(compilerArgs.field_2._M_local_buf + 0xf));
    pcVar2 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_148);
    std::__cxx11::string::operator=((string *)local_d8,pcVar2);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)(compilerArgs.field_2._M_local_buf + 0xf));
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_90,"gcc");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_170,"-E -P -v -dD ${plugin_state_location}/${specs_file}",&local_171);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)local_d8," ");
    std::operator+(&local_198,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
    std::__cxx11::string::operator=((string *)local_170,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
  }
  std::operator<<((ostream *)fout,
                  "<storageModule moduleId=\"scannerConfiguration\">\n<autodiscovery enabled=\"true\" problemReportingEnabled=\"true\" selectedProfileId=\"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile\"/>\n"
                 );
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1b8,"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile",
             &local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"specsFile",&local_209);
  AppendScannerProfile
            (fout,&local_1b8,true,&local_1e0,true,&local_208,(string *)local_170,(string *)local_90,
             true,true);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_230,"org.eclipse.cdt.make.core.GCCStandardMakePerFileProfile",
             &local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"",&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"makefileGenerator",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"-f ${project_name}_scd.mk",&local_2a9);
  AppendScannerProfile
            (fout,&local_230,true,&local_258,true,&local_280,&local_2a8,(string *)local_38,true,true
            );
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::operator<<((ostream *)fout,"</storageModule>\n");
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator
::AppendStorageScanners(cmGeneratedFileStream& fout,
                        const cmMakefile& makefile)
{
  // we need the "make" and the C (or C++) compiler which are used, Alex
  std::string make = makefile.GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler = makefile.GetSafeDefinition("CMAKE_C_COMPILER");
  std::string arg1 = makefile.GetSafeDefinition("CMAKE_C_COMPILER_ARG1");
  if (compiler.empty())
    {
    compiler = makefile.GetSafeDefinition("CMAKE_CXX_COMPILER");
    arg1 = makefile.GetSafeDefinition("CMAKE_CXX_COMPILER_ARG1");
    }
  if (compiler.empty())  //Hmm, what to do now ?
    {
    compiler = "gcc";
    }

  // the following right now hardcodes gcc behaviour :-/
  std::string compilerArgs =
                         "-E -P -v -dD ${plugin_state_location}/${specs_file}";
  if (!arg1.empty())
    {
    arg1 += " ";
    compilerArgs = arg1 + compilerArgs;
    }

  fout <<
    "<storageModule moduleId=\"scannerConfiguration\">\n"
    "<autodiscovery enabled=\"true\" problemReportingEnabled=\"true\""
    " selectedProfileId="
    "\"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile\"/>\n"
    ;
  cmExtraEclipseCDT4Generator::AppendScannerProfile(fout,
    "org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile",
    true, "", true, "specsFile",
    compilerArgs,
    compiler, true, true);
  cmExtraEclipseCDT4Generator::AppendScannerProfile(fout,
    "org.eclipse.cdt.make.core.GCCStandardMakePerFileProfile",
    true, "", true, "makefileGenerator",
    "-f ${project_name}_scd.mk",
    make, true, true);

  fout << "</storageModule>\n";
}